

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.h
# Opt level: O1

void __thiscall
midi_container::limit_port_number<unsigned_long>(midi_container *this,unsigned_long *number)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  bool bVar6;
  uchar local_11;
  
  pbVar1 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pbVar2 - (long)pbVar1;
  bVar6 = pbVar2 != pbVar1;
  if (bVar6) {
    if (*number == (ulong)*pbVar1) {
      uVar5 = 0;
    }
    else {
      uVar3 = 1;
      do {
        uVar5 = uVar3;
        bVar6 = uVar5 < uVar4;
        if (uVar4 <= uVar5) goto LAB_001085fb;
        uVar3 = (ulong)((int)uVar5 + 1);
      } while (*number != (ulong)pbVar1[uVar5]);
    }
    *number = uVar5;
    if (bVar6) {
      return;
    }
  }
LAB_001085fb:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_port_numbers,&local_11);
  *number = (unsigned_long)
            ((this->m_port_numbers).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
            ~(ulong)(this->m_port_numbers).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  return;
}

Assistant:

void limit_port_number(T & number)
    {
        for ( unsigned i = 0; i < m_port_numbers.size(); i++ )
        {
            if ( m_port_numbers[ i ] == number )
            {
                number = i;
                return;
            }
        }
        m_port_numbers.push_back( (const uint8_t) number );
        number = m_port_numbers.size() - 1;
    }